

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O0

void on_underlying_io_close_complete(void *context)

{
  int iVar1;
  TLS_IO_INSTANCE *tls_io_instance;
  void *context_local;
  
  iVar1 = *(int *)((long)context + 0x68);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      *(undefined4 *)((long)context + 0x68) = 0;
      indicate_open_complete((TLS_IO_INSTANCE *)context,IO_OPEN_ERROR);
    }
    else if (((2 < iVar1 - 2U) && (iVar1 == 5)) &&
            (*(undefined4 *)((long)context + 0x68) = 0, *(long *)((long)context + 0x18) != 0)) {
      (**(code **)((long)context + 0x18))(*(undefined8 *)((long)context + 0x38));
    }
  }
  close_openssl_instance((TLS_IO_INSTANCE *)context);
  return;
}

Assistant:

static void on_underlying_io_close_complete(void* context)
{
    if (context == NULL)
    {
        /* Cdoes_SRS_HTTP_PROXY_IO_01_084: [ on_underlying_io_close_complete called with NULL context shall do nothing. ]*/
        LogError("NULL context in on_underlying_io_open_complete");
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)context;

        switch (http_proxy_io_instance->http_proxy_io_state)
        {
        default:
            LogError("on_underlying_io_close_complete called in an invalid state");
            break;

        case HTTP_PROXY_IO_STATE_CLOSING:
            http_proxy_io_instance->http_proxy_io_state = HTTP_PROXY_IO_STATE_CLOSED;

            /* Codes_SRS_HTTP_PROXY_IO_01_086: [ If the on_io_close_complete callback passed to http_proxy_io_close was NULL, no callback shall be triggered. ]*/
            if (http_proxy_io_instance->on_io_close_complete != NULL)
            {
                /* Codes_SRS_HTTP_PROXY_IO_01_083: [ on_underlying_io_close_complete while CLOSING shall call the on_io_close_complete callback, passing to it the on_io_close_complete_context as context argument. ]*/
                http_proxy_io_instance->on_io_close_complete(http_proxy_io_instance->on_io_close_complete_context);
            }

            break;
        }
    }
}